

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# baseexc.hpp
# Opt level: O0

void __thiscall MetaSim::BaseExc::BaseExc(BaseExc *this,string *message,string *cl,string *md)

{
  ostream *poVar1;
  string *in_RCX;
  string *in_RDX;
  string *in_RSI;
  runtime_error *in_RDI;
  stringstream ss;
  string local_1e8 [32];
  runtime_error local_1c8 [32];
  stringstream local_1a8 [16];
  ostream local_198 [376];
  string *local_20;
  string *local_18;
  string *local_10;
  
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  std::runtime_error::runtime_error(in_RDI,"");
  *(undefined ***)in_RDI = &PTR__BaseExc_00167808;
  std::__cxx11::string::string((string *)(in_RDI + 0x10));
  std::__cxx11::stringstream::stringstream(local_1a8);
  poVar1 = std::operator<<(local_198,"Class=");
  poVar1 = std::operator<<(poVar1,local_18);
  poVar1 = std::operator<<(poVar1," Module=");
  poVar1 = std::operator<<(poVar1,local_20);
  poVar1 = std::operator<<(poVar1," Message:");
  std::operator<<(poVar1,local_10);
  std::__cxx11::stringstream::str();
  std::runtime_error::runtime_error(local_1c8,local_1e8);
  std::runtime_error::operator=(in_RDI,local_1c8);
  std::runtime_error::~runtime_error(local_1c8);
  std::__cxx11::string::~string(local_1e8);
  std::__cxx11::stringstream::~stringstream(local_1a8);
  return;
}

Assistant:

BaseExc(const std::string &message,
                const std::string &cl="unknown",
                const std::string &md="unknown") :
          std::runtime_error("")
              {
                  std::stringstream ss;
                  ss << "Class=" << cl
                     << " Module=" << md
                     << " Message:" << message;
                  static_cast<std::runtime_error&>(*this) = std::runtime_error(ss.str());
              }